

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

Error __thiscall
asmjit::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneHeap *heap,size_t newLength,size_t idealCapacity,
          bool newBitsValue)

{
  long *__src;
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong in_RCX;
  ulong in_RDX;
  long *in_RSI;
  long *in_RDI;
  byte in_R8B;
  size_t endIdx;
  size_t nBits;
  BitWord pattern;
  size_t endBit;
  size_t startBit;
  size_t idx;
  size_t allocatedCapacityInBits;
  BitWord *newData;
  size_t minimumCapacity;
  size_t allocatedCapacity;
  size_t minimumCapacityInBits;
  BitWord *data;
  size_t oldLength;
  size_t bit;
  size_t idx_1;
  uint32_t slot;
  BitWord bitAsWord;
  char *in_stack_00000290;
  int in_stack_0000029c;
  char *in_stack_000002a0;
  bool local_159;
  long *size;
  ZoneHeap *in_stack_fffffffffffffec0;
  byte local_138;
  ulong local_118;
  ulong local_110;
  ulong local_f8;
  long *local_e8;
  size_t *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  uint local_6c;
  ulong local_68;
  long *local_60;
  undefined4 local_44;
  ulong local_30;
  ulong local_28;
  byte local_19;
  uint *local_18;
  ulong local_10;
  char local_1;
  
  bVar1 = in_R8B & 1;
  if (in_RCX < in_RDX) {
    DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
  }
  if (in_RDX <= (ulong)in_RDI[1]) {
    if ((in_RDX & 0x3f) != 0) {
      *(ulong *)(*in_RDI + (in_RDX >> 6) * 8) =
           (1L << (sbyte)(in_RDX & 0x3f)) - 1U & *(ulong *)(*in_RDI + (in_RDX >> 6) * 8);
    }
    in_RDI[1] = in_RDX;
    return 0;
  }
  uVar3 = in_RDI[1];
  __src = (long *)*in_RDI;
  local_e8 = __src;
  if ((ulong)in_RDI[2] < in_RDX) {
    local_44 = 0x40;
    local_110 = in_RCX + 0x3f & 0xffffffffffffffc0;
    if (local_110 < in_RDX) {
      return 1;
    }
    if (*in_RSI == 0) {
      DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
    }
    size = in_RSI;
    local_e8 = (long *)ZoneHeap::_alloc((ZoneHeap *)
                                        (CONCAT17(in_R8B,in_stack_ffffffffffffff38) &
                                        0x1ffffffffffffff),in_stack_ffffffffffffff30,
                                        in_stack_ffffffffffffff28);
    if (local_e8 == (long *)0x0) {
      return 1;
    }
    if (local_f8 <= local_f8 << 3) {
      local_110 = local_f8 << 3;
    }
    if (uVar3 != 0) {
      local_30 = uVar3;
      memcpy(local_e8,__src,(uVar3 + 0x40 >> 6) - 1);
    }
    if (__src != (long *)0x0) {
      local_68 = (ulong)in_RDI[2] >> 3;
      local_60 = __src;
      if (*in_RSI == 0) {
        DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
      }
      if (__src == (long *)0x0) {
        DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
      }
      if (local_68 == 0) {
        DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
      }
      local_18 = &local_6c;
      local_10 = local_68;
      if (local_68 == 0) {
        DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
      }
      if (local_68 < 0x201) {
        if (local_68 < 0x81) {
          local_6c = (uint)(local_68 - 1 >> 5);
        }
        else {
          local_6c = (int)(local_68 - 0x81 >> 6) + 4;
        }
        local_1 = '\x01';
      }
      else {
        local_1 = '\0';
      }
      if (local_1 == '\0') {
        ZoneHeap::_releaseDynamic(in_stack_fffffffffffffec0,in_RDI,(size_t)size);
      }
      else {
        *__src = in_RSI[(ulong)local_6c + 1];
        in_RSI[(ulong)local_6c + 1] = (long)__src;
      }
    }
    *in_RDI = (long)local_e8;
    in_RDI[2] = local_110;
  }
  uVar2 = uVar3 >> 6;
  uVar3 = uVar3 & 0x3f;
  uVar4 = in_RDX & 0x3f;
  local_19 = bVar1 & 1;
  local_28 = (ulong)local_19;
  local_159 = 1 < local_28;
  if (local_159) {
    DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
  }
  local_118 = uVar2;
  if (uVar3 != 0) {
    if (uVar2 == in_RDX >> 6) {
      if (uVar4 <= uVar3) {
        DebugUtils::assertionFailed(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
      }
      local_138 = (sbyte)uVar4 - (char)uVar3;
    }
    else {
      local_138 = 0x40 - (char)uVar3;
    }
    local_118 = uVar2 + 1;
    local_e8[uVar2] = -local_28 << (local_138 & 0x3f) | local_e8[uVar2];
  }
  lVar5 = (in_RDX + 0x40 >> 6) - 1;
  uVar3 = lVar5 - (ulong)(lVar5 * 0x40 == in_RDX);
  while (local_118 <= uVar3) {
    local_e8[local_118] = -local_28;
    local_118 = local_118 + 1;
  }
  if (uVar4 != 0) {
    local_e8[uVar3] = (1L << (sbyte)uVar4) - 1U & local_e8[uVar3];
  }
  in_RDI[1] = in_RDX;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneHeap* heap, size_t newLength, size_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newLength);

  if (newLength <= _length) {
    // The size after the resize is lesser than or equal to the current length.
    size_t idx = newLength / kBitsPerWord;
    size_t bit = newLength % kBitsPerWord;

    // Just set all bits outside of the new length in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newLength` is a multiply of `kBitsPerWord` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_length`.
    if (bit)
      _data[idx] &= (static_cast<uintptr_t>(1) << bit) - 1U;

    _length = newLength;
    return kErrorOk;
  }

  size_t oldLength = _length;
  BitWord* data = _data;

  if (newLength > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) requied.
    size_t minimumCapacityInBits = Utils::alignTo<size_t>(idealCapacity, kBitsPerWord);
    size_t allocatedCapacity;

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newLength))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // Normalize to bytes.
    size_t minimumCapacity = minimumCapacityInBits / 8;
    BitWord* newData = static_cast<BitWord*>(heap->alloc(minimumCapacity, allocatedCapacity));

    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_heap->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (oldLength)
      ::memcpy(newData, data, _wordsPerBits(oldLength));

    if (data)
      heap->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = allocatedCapacityInBits;
  }

  // Start (of the old length) and end (of the new length) bits
  size_t idx = oldLength / kBitsPerWord;
  size_t startBit = oldLength % kBitsPerWord;
  size_t endBit = newLength % kBitsPerWord;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = _patternFromBit(newBitsValue);

  // First initialize the last bit-word of the old length.
  if (startBit) {
    size_t nBits = 0;

    if (idx == (newLength / kBitsPerWord)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old length.
      nBits = kBitsPerWord - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old length.
  size_t endIdx = _wordsPerBits(newLength);
  endIdx -= static_cast<size_t>(endIdx * kBitsPerWord == newLength);

  while (idx <= endIdx)
    data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx] &= (static_cast<BitWord>(1) << endBit) - 1;

  _length = newLength;
  return kErrorOk;
}